

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::shiftPvec(SPxSolverBase<double> *this)

{
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  pointer pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Real RVar10;
  double dVar11;
  double dVar12;
  DataKey local_28;
  
  dVar7 = leavetol(this);
  dVar7 = dVar7 * 10.0;
  dVar8 = leavetol(this);
  dVar8 = dVar8 * 100.0;
  dVar9 = leavetol(this);
  RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  dVar9 = dVar9 - RVar10;
  lVar5 = (long)(this->thecovectors->set).thenum;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      local_28 = (DataKey)coId(this,(int)lVar5 + -2);
      bVar3 = isBasic(this,(SPxId *)&local_28);
      pdVar4 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = pdVar4[lVar5 + -2];
      dVar12 = (this->theCoPvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar5 + 0xfffffffffffffffe];
      if ((bVar3) || (dVar12 < dVar9 + dVar6)) {
        pdVar2 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar11 = pdVar2[lVar5 + -2];
        if (!bVar3 && dVar12 <= dVar11 - dVar9) {
          if ((dVar6 != dVar11) || (NAN(dVar6) || NAN(dVar11))) {
            RVar10 = Random::next_random(&this->random);
            dVar12 = dVar12 - (RVar10 * dVar8 + (1.0 - RVar10) * dVar7);
            pdVar4 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar11 = (double)-(ulong)(dVar12 < pdVar4[lVar5 + -2]);
            dVar6 = pdVar4[lVar5 + -2] - dVar12;
            goto LAB_001f8c7b;
          }
          this->theShift =
               (double)((ulong)(dVar11 - dVar12) & -(ulong)(dVar12 < dVar11)) + this->theShift;
          pdVar2[lVar5 + -2] = dVar12;
          pdVar4[lVar5 + -2] = dVar12;
        }
      }
      else {
        pdVar2 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = pdVar2 + lVar5 + -2;
        if ((dVar6 != *pdVar1) || (NAN(dVar6) || NAN(*pdVar1))) {
          RVar10 = Random::next_random(&this->random);
          dVar12 = dVar12 + RVar10 * dVar8 + (1.0 - RVar10) * dVar7;
          pdVar4 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar11 = dVar12 - pdVar4[lVar5 + -2];
          dVar6 = (double)-(ulong)(pdVar4[lVar5 + -2] < dVar12);
LAB_001f8c7b:
          this->theShift = (double)((ulong)dVar6 & (ulong)dVar11) + this->theShift;
          pdVar4[lVar5 + -2] = dVar12;
        }
        else {
          this->theShift =
               (double)(-(ulong)(dVar6 < dVar12) & (ulong)(dVar12 - dVar6)) + this->theShift;
          pdVar4[lVar5 + -2] = dVar12;
          pdVar2[lVar5 + -2] = dVar12;
        }
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)(this->thevectors->set).thenum;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      local_28 = (DataKey)id(this,(int)lVar5 + -2);
      bVar3 = isBasic(this,(SPxId *)&local_28);
      pdVar4 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = pdVar4[lVar5 + -2];
      dVar12 = (this->thePvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar5 + 0xfffffffffffffffe];
      if ((bVar3) || (dVar12 < dVar9 + dVar6)) {
        pdVar2 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar11 = pdVar2[lVar5 + -2];
        if (!bVar3 && dVar12 <= dVar11 - dVar9) {
          if ((dVar6 != dVar11) || (NAN(dVar6) || NAN(dVar11))) {
            RVar10 = Random::next_random(&this->random);
            dVar12 = dVar12 - (RVar10 * dVar8 + (1.0 - RVar10) * dVar7);
            pdVar4 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar11 = (double)-(ulong)(dVar12 < pdVar4[lVar5 + -2]);
            dVar6 = pdVar4[lVar5 + -2] - dVar12;
            goto LAB_001f8e71;
          }
          this->theShift =
               (double)((ulong)(dVar11 - dVar12) & -(ulong)(dVar12 < dVar11)) + this->theShift;
          pdVar2[lVar5 + -2] = dVar12;
          pdVar4[lVar5 + -2] = dVar12;
        }
      }
      else {
        pdVar2 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = pdVar2 + lVar5 + -2;
        if ((dVar6 != *pdVar1) || (NAN(dVar6) || NAN(*pdVar1))) {
          RVar10 = Random::next_random(&this->random);
          dVar12 = dVar12 + RVar10 * dVar8 + (1.0 - RVar10) * dVar7;
          pdVar4 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar11 = dVar12 - pdVar4[lVar5 + -2];
          dVar6 = (double)-(ulong)(pdVar4[lVar5 + -2] < dVar12);
LAB_001f8e71:
          this->theShift = (double)((ulong)dVar6 & (ulong)dVar11) + this->theShift;
          pdVar4[lVar5 + -2] = dVar12;
        }
        else {
          this->theShift =
               (double)(-(ulong)(dVar6 < dVar12) & (ulong)(dVar12 - dVar6)) + this->theShift;
          pdVar4[lVar5 + -2] = dVar12;
          pdVar2[lVar5 + -2] = dVar12;
        }
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}